

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

void __thiscall rsg::ValueRange::ValueRange(ValueRange *this,ConstValueRangeAccess other)

{
  pointer pSVar1;
  int iVar2;
  StridedValueRead<1> local_48;
  StridedValueAccess<1> local_38;
  
  VariableType::VariableType(&this->m_type,other.m_type);
  iVar2 = VariableType::getScalarSize(other.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_min,(long)iVar2,(allocator_type *)&local_48);
  iVar2 = VariableType::getScalarSize(other.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_max,(long)iVar2,(allocator_type *)&local_48);
  local_48.m_type = other.m_type;
  local_48.m_value = other.m_min;
  pSVar1 = (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  if (pSVar1 != (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_38.super_ConstStridedValueAccess<1>.m_value = pSVar1;
  }
  local_38.super_ConstStridedValueAccess<1>.m_type = &this->m_type;
  StridedValueAccess<1>::operator=(&local_38,&local_48);
  local_48.m_type = other.m_type;
  local_48.m_value = other.m_max;
  pSVar1 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  if (pSVar1 != (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_38.super_ConstStridedValueAccess<1>.m_value = pSVar1;
  }
  local_38.super_ConstStridedValueAccess<1>.m_type = &this->m_type;
  StridedValueAccess<1>::operator=(&local_38,&local_48);
  return;
}

Assistant:

ValueRange::ValueRange (ConstValueRangeAccess other)
	: m_type		(other.getType())
	, m_min			(other.getType().getScalarSize())
	, m_max			(other.getType().getScalarSize())
{
	getMin() = other.getMin().value();
	getMax() = other.getMax().value();
}